

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_void>
     ::serialize_elems<binlog::detail::QueueWriter>
               (long param_1,undefined8 param_2,undefined8 param_3)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(param_1 + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(param_1 + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    BuiltinSerializer<std::pair<char_const,std::__cxx11::string>,void>::
    serialize_elems<binlog::detail::QueueWriter,0ul,1ul>(p_Var1 + 1,param_3);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }